

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_addgsub(luaL_Buffer *b,char *s,char *p,char *r)

{
  size_t sVar1;
  char *pcVar2;
  size_t l;
  char *wild;
  char *r_local;
  char *p_local;
  char *s_local;
  luaL_Buffer *b_local;
  
  sVar1 = strlen(p);
  p_local = s;
  while( true ) {
    pcVar2 = strstr(p_local,p);
    if (pcVar2 == (char *)0x0) break;
    luaL_addlstring(b,p_local,(long)pcVar2 - (long)p_local);
    luaL_addstring(b,r);
    p_local = pcVar2 + sVar1;
  }
  luaL_addstring(b,p_local);
  return;
}

Assistant:

LUALIB_API void luaL_addgsub (luaL_Buffer *b, const char *s,
                                     const char *p, const char *r) {
  const char *wild;
  size_t l = strlen(p);
  while ((wild = strstr(s, p)) != NULL) {
    luaL_addlstring(b, s, ct_diff2sz(wild - s));  /* push prefix */
    luaL_addstring(b, r);  /* push replacement in place of pattern */
    s = wild + l;  /* continue after 'p' */
  }
  luaL_addstring(b, s);  /* push last suffix */
}